

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::next(TaggerImpl *this)

{
  uint uVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  char *in_RDI;
  char *result;
  Lattice *lattice;
  TaggerImpl *in_stack_ffffffffffffffe0;
  TaggerImpl *local_8;
  
  pLVar3 = mutable_lattice(in_stack_ffffffffffffffe0);
  uVar1 = (*pLVar3->_vptr_Lattice[0x10])();
  if ((uVar1 & 1) == 0) {
    (*pLVar3->_vptr_Lattice[0x25])(pLVar3,"no more results");
    local_8 = (TaggerImpl *)0x0;
  }
  else {
    iVar2 = (*pLVar3->_vptr_Lattice[0x18])();
    local_8 = (TaggerImpl *)CONCAT44(extraout_var,iVar2);
    if (local_8 == (TaggerImpl *)0x0) {
      (*pLVar3->_vptr_Lattice[0x24])();
      set_what(local_8,in_RDI);
      local_8 = (TaggerImpl *)0x0;
    }
  }
  return (char *)local_8;
}

Assistant:

const char* TaggerImpl::next() {
  Lattice *lattice = mutable_lattice();
  if (!lattice->next()) {
    lattice->set_what("no more results");
    return 0;
  }
  const char *result = lattice->toString();
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}